

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O3

validation_message * __thiscall
jsoncons::jsonschema::
keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_validation_message
          (validation_message *__return_storage_ptr__,
          keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *this,json_pointer *eval_path,json_pointer *instance_location,string *message,
          vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
          *details)

{
  string *message_00;
  
  message_00 = &this->custom_message_;
  if ((this->custom_message_)._M_string_length == 0) {
    message_00 = message;
  }
  validation_message::validation_message
            (__return_storage_ptr__,&this->keyword_name_,eval_path,&this->schema_location_,
             instance_location,message_00,details);
  return __return_storage_ptr__;
}

Assistant:

validation_message make_validation_message(const jsonpointer::json_pointer& eval_path,
            const jsonpointer::json_pointer& instance_location,
            const std::string& message,
            const std::vector<validation_message>& details) const override
        {
            return validation_message(keyword_name_, 
                eval_path,
                schema_location_, 
                instance_location, 
                custom_message_.empty() ? message : custom_message_,
                details);
        }